

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int device_init(device_data **dp,nni_sock *s1,nni_sock *s2)

{
  nni_sock *pnVar1;
  _Bool _Var2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  device_data *pdVar6;
  device_path *arg;
  nni_sock *local_60;
  nni_sock *local_58;
  device_path *p;
  nni_sock *temp;
  device_data *d;
  int i;
  int num_paths;
  nni_sock *s2_local;
  nni_sock *s1_local;
  device_data **dp_local;
  
  d._4_4_ = 2;
  s2_local = s1;
  if (s1 == (nni_sock *)0x0) {
    s2_local = s2;
  }
  pnVar1 = s2_local;
  _i = s2;
  if (s2 == (nni_sock *)0x0) {
    _i = s2_local;
  }
  if ((s2_local != (nni_sock *)0x0) && (_i != (nni_sock *)0x0)) {
    uVar3 = nni_sock_peer_id(s2_local);
    uVar4 = nni_sock_proto_id(_i);
    if (uVar3 == uVar4) {
      uVar3 = nni_sock_peer_id(_i);
      uVar4 = nni_sock_proto_id(s2_local);
      if (uVar3 == uVar4) {
        _Var2 = nni_sock_raw(s2_local);
        if (!_Var2) {
          return 3;
        }
        _Var2 = nni_sock_raw(_i);
        if (_Var2) {
          uVar5 = nni_sock_flags(s2_local);
          if ((uVar5 & 1) == 0) {
            s2_local = _i;
            _i = pnVar1;
          }
          uVar5 = nni_sock_flags(s2_local);
          if ((uVar5 & 1) == 0) {
            nni_panic("%s: %d: assert err: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/device.c"
                      ,0xaa,"(nni_sock_flags(s1) & NNI_PROTO_FLAG_RCV) != 0");
          }
          uVar5 = nni_sock_flags(_i);
          if (((uVar5 & 1) == 0) || (s2_local == _i)) {
            d._4_4_ = 1;
          }
          pdVar6 = (device_data *)nni_zalloc(0x3f0);
          if (pdVar6 != (device_data *)0x0) {
            pdVar6->num_paths = 0;
            for (d._0_4_ = 0; (int)d < d._4_4_; d._0_4_ = (int)d + 1) {
              arg = pdVar6->paths + (int)d;
              if ((int)d == 0) {
                local_58 = s2_local;
              }
              else {
                local_58 = _i;
              }
              arg->src = local_58;
              if ((int)d == 0) {
                local_60 = _i;
              }
              else {
                local_60 = s2_local;
              }
              arg->dst = local_60;
              arg->d = pdVar6;
              arg->state = 0;
              nni_aio_init(&arg->aio,device_cb,arg);
              nni_aio_set_timeout(&arg->aio,-1);
            }
            nni_sock_hold(pdVar6->paths[0].src);
            nni_sock_hold(pdVar6->paths[0].dst);
            pdVar6->num_paths = d._4_4_;
            *dp = pdVar6;
            return 0;
          }
          return 2;
        }
        return 3;
      }
    }
  }
  return 3;
}

Assistant:

static int
device_init(device_data **dp, nni_sock *s1, nni_sock *s2)
{
	int          num_paths = 2;
	int          i;
	device_data *d;

	// Specifying either of these as null turns the device into
	// a reflector.
	if (s1 == NULL) {
		s1 = s2;
	}
	if (s2 == NULL) {
		s2 = s1;
	}
	// At least one of the sockets must be valid.
	if ((s1 == NULL) || (s2 == NULL)) {
		return (NNG_EINVAL);
	}
	if ((nni_sock_peer_id(s1) != nni_sock_proto_id(s2)) ||
	    (nni_sock_peer_id(s2) != nni_sock_proto_id(s1))) {
		return (NNG_EINVAL);
	}

	if (!nni_sock_raw(s1)) {
		return (NNG_EINVAL);
	}

	if (!nni_sock_raw(s2)) {
		return (NNG_EINVAL);
	}

	// Note we assume that since they are peers, we only need to look
	// at the recv flags -- the other side is assumed to be able
	// to send.
	if ((nni_sock_flags(s1) & NNI_PROTO_FLAG_RCV) == 0) {
		nni_sock *temp = s1;
		s1             = s2;
		s2             = temp;
	}

	NNI_ASSERT((nni_sock_flags(s1) & NNI_PROTO_FLAG_RCV) != 0);

	// Only run one forwarder if the protocols are not bidirectional, or
	// if the source and destination sockets are identical.  (The latter is
	// not strictly necessary, but it saves resources and minimizes any
	// extra reordering.)
	if (((nni_sock_flags(s2) & NNI_PROTO_FLAG_RCV) == 0) || (s1 == s2)) {
		num_paths = 1;
	}

	if ((d = NNI_ALLOC_STRUCT(d)) == NULL) {
		return (NNG_ENOMEM);
	}

	d->num_paths = 0;
	for (i = 0; i < num_paths; i++) {
		device_path *p = &d->paths[i];
		p->src         = i == 0 ? s1 : s2;
		p->dst         = i == 0 ? s2 : s1;
		p->d           = d;
		p->state       = NNI_DEVICE_STATE_INIT;

		nni_aio_init(&p->aio, device_cb, p);

		nni_aio_set_timeout(&p->aio, NNG_DURATION_INFINITE);
	}
	nni_sock_hold(d->paths[0].src);
	nni_sock_hold(d->paths[0].dst);

	d->num_paths = num_paths;
	*dp          = d;
	return (0);
}